

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BS_thread_pool.hpp
# Opt level: O0

void __thiscall BS::thread_pool::create_threads(thread_pool *this)

{
  type this_00;
  thread_pool *local_38;
  code *local_30;
  undefined8 local_28;
  thread local_20;
  uint local_14;
  thread_pool *ptStack_10;
  concurrency_t i;
  thread_pool *this_local;
  
  ptStack_10 = this;
  std::atomic<bool>::operator=(&this->running,true);
  for (local_14 = 0; local_14 < this->thread_count; local_14 = local_14 + 1) {
    local_30 = worker;
    local_28 = 0;
    local_38 = this;
    std::thread::thread<void(BS::thread_pool::*)(),BS::thread_pool*,void>
              (&local_20,(type *)&local_30,&local_38);
    this_00 = std::unique_ptr<std::thread[],_std::default_delete<std::thread[]>_>::operator[]
                        (&this->threads,(ulong)local_14);
    std::thread::operator=(this_00,&local_20);
    std::thread::~thread(&local_20);
  }
  return;
}

Assistant:

void create_threads()
    {
        running = true;
        for (concurrency_t i = 0; i < thread_count; ++i)
        {
            threads[i] = std::thread(&thread_pool::worker, this);
        }
    }